

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O0

void __thiscall
SuiteParserTests::extractLengthFixture::extractLengthFixture(extractLengthFixture *this)

{
  extractLengthFixture *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->badLength);
  std::__cxx11::string::string((string *)&this->negativeLength);
  std::__cxx11::string::string((string *)&this->incomplete_1);
  std::__cxx11::string::string((string *)&this->incomplete_2);
  FIX::Parser::Parser(&this->object);
  std::__cxx11::string::operator=((string *)this,"8=FIX.4.2\x019=12\x0135=A\x01108=30\x0110=31\x01")
  ;
  std::__cxx11::string::operator=
            ((string *)&this->badLength,"8=FIX.4.2\x019=A\x0135=A\x01108=30\x0110=31\x01");
  std::__cxx11::string::operator=
            ((string *)&this->negativeLength,"8=FIX.4.2\x019=-1\x0135=A\x01108=30\x0110=31\x01");
  std::__cxx11::string::operator=((string *)&this->incomplete_1,"8=FIX.4.2");
  std::__cxx11::string::operator=((string *)&this->incomplete_2,"8=FIX.4.2\x019=12");
  return;
}

Assistant:

extractLengthFixture()
  {
    normalLength   = "8=FIX.4.2\0019=12\00135=A\001108=30\00110=31\001";
    badLength      = "8=FIX.4.2\0019=A\00135=A\001108=30\00110=31\001";
    negativeLength = "8=FIX.4.2\0019=-1\00135=A\001108=30\00110=31\001";
    incomplete_1   = "8=FIX.4.2";
    incomplete_2   = "8=FIX.4.2\0019=12";
  }